

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t
exr_attr_string_set_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  char *__dest;
  int in_ECX;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  char *sstr;
  _internal_exr_context *pctxt;
  undefined4 in_stack_ffffffffffffffd8;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (exr_context_t)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid string argument to string set");
  }
  else if (in_ECX < 0) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,3,"Received request to assign a negative sized string (%d)",in_ECX);
  }
  else if (in_ECX < *(int *)(in_RSI + 4)) {
    *(int *)in_RSI = in_ECX;
    __dest = *(char **)(in_RSI + 8);
    if (0 < in_ECX) {
      if (in_RDX == (exr_attr_string_t *)0x0) {
        memset(__dest,0,(long)in_ECX);
      }
      else {
        strncpy(__dest,(char *)in_RDX,(long)in_ECX);
      }
    }
    __dest[in_ECX] = '\0';
    local_4 = 0;
  }
  else {
    exr_attr_string_destroy(in_RSI,in_RDX);
    local_4 = exr_attr_string_create_with_length
                        (in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (int32_t)((ulong)in_RDI >> 0x20));
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_set_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string argument to string set");

    if (len < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to assign a negative sized string (%d)",
            len);

    if (s->alloc_size > len)
    {
        s->length = len;
        /* we own the memory */
        char* sstr = EXR_CONST_CAST (char*, s->str);
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#endif
            if (d)
                strncpy (sstr, d, (size_t) len);
            else
                memset (sstr, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#endif
        }
        sstr[len] = '\0';
        return EXR_ERR_SUCCESS;
    }
    exr_attr_string_destroy (ctxt, s);
    return exr_attr_string_create_with_length (ctxt, s, d, len);
}